

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_validator_options.h
# Opt level: O2

void __thiscall spv_validator_options_t::spv_validator_options_t(spv_validator_options_t *this)

{
  (this->universal_limits_).max_switch_branches = 0;
  (this->universal_limits_).max_function_args = 0;
  (this->universal_limits_).max_control_flow_nesting_depth = 0;
  (this->universal_limits_).max_access_chain_indexes = 0;
  (this->universal_limits_).max_struct_members = 0;
  (this->universal_limits_).max_struct_depth = 0;
  (this->universal_limits_).max_local_variables = 0;
  (this->universal_limits_).max_global_variables = 0;
  (this->universal_limits_).max_id_bound = 0;
  validator_universal_limits_t::validator_universal_limits_t(&this->universal_limits_);
  this->relax_struct_store = false;
  this->relax_logical_pointer = false;
  this->relax_block_layout = false;
  this->uniform_buffer_standard_layout = false;
  this->scalar_block_layout = false;
  this->workgroup_scalar_block_layout = false;
  this->skip_block_layout = false;
  this->allow_localsizeid = false;
  this->before_hlsl_legalization = false;
  this->use_friendly_names = true;
  return;
}

Assistant:

spv_validator_options_t()
      : universal_limits_(),
        relax_struct_store(false),
        relax_logical_pointer(false),
        relax_block_layout(false),
        uniform_buffer_standard_layout(false),
        scalar_block_layout(false),
        workgroup_scalar_block_layout(false),
        skip_block_layout(false),
        allow_localsizeid(false),
        before_hlsl_legalization(false),
        use_friendly_names(true) {}